

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

size_t pstore::dump::object::property_length<char>(string *p)

{
  element_type *this;
  size_t sVar1;
  size_t in_RCX;
  void *__buf;
  string local_1c8 [48];
  undefined1 local_198 [24];
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> out;
  string *p_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 0x10));
  property((object *)local_198,p);
  this = std::__shared_ptr_access<pstore::dump::string,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<pstore::dump::string,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_198);
  dump::value::write(&this->super_value,(int)local_198 + 0x10,__buf,in_RCX);
  std::shared_ptr<pstore::dump::string>::~shared_ptr((shared_ptr<pstore::dump::string> *)local_198);
  std::__cxx11::ostringstream::str();
  sVar1 = std::__cxx11::string::length();
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_198 + 0x10));
  return sVar1;
}

Assistant:

std::size_t object::property_length (std::string const & p) {
            std::basic_ostringstream<OStreamCharType> out;
            object::property (p)->write (out);
            return out.str ().length ();
        }